

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O0

State QUnicodeTools::LB::BRS::updateState(State state,LinebreakUnit lb)

{
  bool bVar1;
  State state_local;
  LinebreakUnit lb_local;
  State local_4;
  
  lb_local.lbc = lb.lbc;
  local_4 = state;
  if (lb_local.lbc != LineBreak_CM) {
    lb_local.ucs4 = lb.ucs4;
    switch(state) {
    case None:
      bVar1 = true;
      if ((lb_local.ucs4 != L'◌') && (bVar1 = true, lb_local.lbc != LineBreak_AK)) {
        bVar1 = lb_local.lbc == LineBreak_AS;
      }
      if (bVar1) {
        return Start;
      }
      break;
    case Start:
      if (lb_local.lbc == LineBreak_VF) {
        return LB28a_2VF;
      }
      if (lb_local.lbc == LineBreak_VI) {
        return LB28a_2VI;
      }
      if (((lb_local.ucs4 == L'◌') || (lb_local.lbc == LineBreak_AK)) ||
         (lb_local.lbc == LineBreak_AS)) {
        return LB28a_4;
      }
      break;
    case LB28a_2VF:
    case LB28a_3VIAK:
    case LB28a_4VF:
    case Restart:
      break;
    case LB28a_2VI:
      if ((lb_local.ucs4 == L'◌') || (lb_local.lbc == LineBreak_AK)) {
        return LB28a_3VIAK;
      }
      break;
    case LB28a_4:
      if (lb_local.lbc == LineBreak_VF) {
        return LB28a_4VF;
      }
      return Restart;
    }
    local_4 = None;
  }
  return local_4;
}

Assistant:

State updateState(State state, LinebreakUnit lb)
    {
        using LBC = QUnicodeTables::LineBreakClass;
        if (lb.lbc == LBC::LineBreak_CM)
            return state;

        switch (state) {
        case Start:
            if (lb.lbc == LBC::LineBreak_VF)
                return LB28a_2VF;
            if (lb.lbc == LBC::LineBreak_VI)
                return LB28a_2VI;
            if (lb.ucs4 == DottedCircle || lb.lbc == LBC::LineBreak_AK
                || lb.lbc == LBC::LineBreak_AS)
                return LB28a_4;
            break;
        case LB28a_2VI:
            if (lb.ucs4 == DottedCircle || lb.lbc == LBC::LineBreak_AK)
                return LB28a_3VIAK;
            break;
        case LB28a_4:
            if (lb.lbc == LBC::LineBreak_VF)
                return LB28a_4VF;
            // Had (AK | [◌] | AS) (AK | [◌] | AS), which could mean the 2nd capture is the start
            // of a new sequence, so we need to check if it makes sense.
            return Restart;
        case None:
            if (Q_UNLIKELY(lb.ucs4 == DottedCircle || lb.lbc == LBC::LineBreak_AK
                           || lb.lbc == LBC::LineBreak_AS)) {
                return Start;
            }
            break;
        case LB28a_2VF:
        case LB28a_4VF:
        case LB28a_3VIAK:
        case Restart:
            // These are all terminal states, so no need to update
            Q_UNREACHABLE();
        }
        return None;
    }